

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O1

int __thiscall coda_url::create_scheme(coda_url *this,char *u,size_t sz,uint32_t flags)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = 8;
  pcVar1 = coda_strxstr(u,"https://",8);
  if (pcVar1 == (char *)0x0) {
    lVar3 = 7;
    pcVar2 = coda_strxstr(u,"http://",7);
    pcVar1 = this->val_str;
    if (pcVar2 == (char *)0x0) {
      builtin_strncpy(pcVar1,"http://",7);
      this->val_len = 7;
      pcVar1 = this->val_str + 7;
    }
  }
  else {
    pcVar1 = this->val_str;
  }
  memcpy(pcVar1,u,sz);
  this->val_len = this->val_len + (int)sz;
  assign_anchor(this,this->val_str + lVar3,flags);
  return 0;
}

Assistant:

int coda_url::create_scheme(const char *u, size_t sz, uint32_t flags)
{
	if (coda_strxstr(u, "https://", 8))
	{
		val_len += coda_cpymsz(val_str, u, sz);
		return assign_anchor(val_str + 8, flags);
	}

	if (coda_strxstr(u, "http://", 7))
	{
		val_len += coda_cpymsz(val_str, u, sz);
		return assign_anchor(val_str + 7, flags);
	}

	val_len = coda_cpymsz(val_str, "http://", sizeof("http://") - 1);
	val_len = coda_cpymsz(val_str + val_len, u, sz) + val_len;
	return assign_anchor(val_str + 7, flags);
}